

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

string * __thiscall
Helpers::readFromFile_abi_cxx11_(string *__return_storage_ptr__,Helpers *this,ifstream *_in)

{
  Helpers *pHVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  runtime_error *this_00;
  fpos local_40 [39];
  undefined1 local_19;
  Helpers *local_18;
  ifstream *_in_local;
  string *tmp;
  
  local_19 = 0;
  local_18 = this;
  _in_local = (ifstream *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar2 = std::ios::operator_cast_to_bool((ios *)(local_18 + *(long *)(*(long *)local_18 + -0x18)));
  if (bVar2) {
    std::istream::seekg((long)local_18,_S_beg);
    local_40._0_16_ = std::istream::tellg();
    sVar3 = std::fpos::operator_cast_to_long(local_40);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (__return_storage_ptr__,sVar3);
    std::istream::seekg((long)local_18,_S_beg);
    pHVar1 = local_18;
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](__return_storage_ptr__,0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (__return_storage_ptr__);
    std::istream::read((char *)pHVar1,(long)pvVar4);
    poVar5 = std::operator<<((ostream *)&std::cout,"Size of input file: ");
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (__return_storage_ptr__);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ifstream::close();
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Error, unable to open file!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Helpers::readFromFile(std::ifstream& _in) {
  std::string tmp;
  if (_in) {
    _in.seekg(0, std::ios::end);
    tmp.resize(_in.tellg());
    _in.seekg(0, std::ios::beg);
    _in.read(&tmp[0], tmp.size());

    std::cout << "Size of input file: " << tmp.size() << std::endl;
    
    _in.close();
  } else
    throw std::runtime_error("Error, unable to open file!");
  return tmp;
}